

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall clask::response_writer::write_headers(response_writer *this)

{
  pointer ppVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  pointer __lhs;
  __string_type res_headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream os;
  
  this->header_out = true;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar2 = std::operator<<((ostream *)&os,"HTTP/1.1 ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->code);
  poVar2 = std::operator<<(poVar2," ");
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)status_codes_abi_cxx11_,&this->code);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"\r\n");
  std::__cxx11::stringbuf::str();
  send(this->s,res_headers._M_dataplus._M_p,(long)(int)res_headers._M_string_length,0x4000);
  ppVar1 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (this->headers).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != ppVar1; __lhs = __lhs + 1) {
    std::operator+(&local_1e8,&__lhs->first,": ");
    std::operator+(&local_1c8,&local_1e8,&__lhs->second);
    std::operator+(&hh,&local_1c8,"\r\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    send(this->s,hh._M_dataplus._M_p,(long)(int)hh._M_string_length,0x4000);
    std::__cxx11::string::~string((string *)&hh);
  }
  send(this->s,"\r\n",2,0x4000);
  std::__cxx11::string::~string((string *)&res_headers);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return;
}

Assistant:

inline void response_writer::write_headers() {
  header_out = true;
  std::ostringstream os;
  os << "HTTP/1.1 " << code << " " << status_codes[code] << "\r\n";
  auto res_headers = os.str();
  send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
  for (auto& h : headers) {
    auto hh = h.first + ": " + h.second + "\r\n";
    send(s, hh.data(), (int) hh.size(), MSG_NOSIGNAL);
  }
  send(s, "\r\n", 2, MSG_NOSIGNAL);
}